

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::doInspection(QPDFJob *this,QPDF *pdf)

{
  pointer this_00;
  bool bVar1;
  longlong i;
  Pipeline *pPVar2;
  element_type *peVar3;
  char *cstr;
  allocator<char> local_92;
  allocator<char> local_91;
  undefined1 local_90 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  QPDFObjectHandle local_70;
  vector<QPDFExc,_std::allocator<QPDFExc>_> local_60;
  string local_40 [32];
  
  QPDFLogger::getInfo((QPDFLogger *)&local_60,
                      SUB81((((this->m).
                              super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->log).
                            super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
  this_00 = local_60.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_60.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
              super__Vector_impl_data._M_finish);
  peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3->check == true) {
    doCheck(this,pdf);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar3->show_npages == true) {
    QPDF::getRoot((QPDF *)local_90);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"/Pages",&local_91);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_90 + 0x10),(string *)local_90);
    std::__cxx11::string::string<std::allocator<char>>(local_40,"/Count",&local_92);
    QPDFObjectHandle::getKey(&local_70,(string *)(local_90 + 0x10));
    i = QPDFObjectHandle::getIntValue(&local_70);
    pPVar2 = Pipeline::operator<<((Pipeline *)this_00,i);
    Pipeline::operator<<(pPVar2,"\n");
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_70.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string(local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
    std::__cxx11::string::~string((string *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar3->show_encryption == true) {
    showEncryption(this,pdf);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar3->check_linearization == true) {
    bVar1 = QPDF::isLinearized(pdf);
    if (bVar1) {
      bVar1 = QPDF::checkLinearization(pdf);
      peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (!bVar1) {
        peVar3->warnings = true;
        goto LAB_0016165a;
      }
      pPVar2 = Pipeline::operator<<
                         ((Pipeline *)this_00,
                          (peVar3->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
      cstr = ": no linearization errors\n";
    }
    else {
      pPVar2 = Pipeline::operator<<
                         ((Pipeline *)this_00,
                          (((this->m).
                            super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      cstr = " is not linearized\n";
    }
    Pipeline::operator<<(pPVar2,cstr);
  }
LAB_0016165a:
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      show_linearization == true) {
    bVar1 = QPDF::isLinearized(pdf);
    if (bVar1) {
      QPDF::showLinearizationData(pdf);
    }
    else {
      pPVar2 = Pipeline::operator<<
                         ((Pipeline *)this_00,
                          (((this->m).
                            super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      Pipeline::operator<<(pPVar2," is not linearized\n");
    }
  }
  peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3->show_xref == true) {
    QPDF::showXRefTable(pdf);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if ((0 < peVar3->show_obj) || (peVar3->show_trailer == true)) {
    doShowObj(this,pdf);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar3->show_pages == true) {
    doShowPages(this,pdf);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar3->list_attachments == true) {
    doListAttachments(this,pdf);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if ((peVar3->attachment_to_show)._M_string_length != 0) {
    doShowAttachment(this,pdf);
  }
  QPDF::getWarnings(&local_60,pdf);
  std::vector<QPDFExc,_std::allocator<QPDFExc>_>::~vector(&local_60);
  if (local_60.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.super__Vector_impl_data
      ._M_start !=
      local_60.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    ((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->warnings =
         true;
  }
  return;
}

Assistant:

void
QPDFJob::doInspection(QPDF& pdf)
{
    auto& cout = *m->log->getInfo();
    if (m->check) {
        doCheck(pdf);
    }
    if (m->show_npages) {
        QTC::TC("qpdf", "QPDFJob npages");
        cout << pdf.getRoot().getKey("/Pages").getKey("/Count").getIntValue() << "\n";
    }
    if (m->show_encryption) {
        showEncryption(pdf);
    }
    if (m->check_linearization) {
        if (!pdf.isLinearized()) {
            cout << m->infilename.get() << " is not linearized\n";
        } else if (pdf.checkLinearization()) {
            cout << m->infilename.get() << ": no linearization errors\n";
        } else {
            m->warnings = true;
        }
    }
    if (m->show_linearization) {
        if (pdf.isLinearized()) {
            pdf.showLinearizationData();
        } else {
            cout << m->infilename.get() << " is not linearized\n";
        }
    }
    if (m->show_xref) {
        pdf.showXRefTable();
    }
    if ((m->show_obj > 0) || m->show_trailer) {
        doShowObj(pdf);
    }
    if (m->show_pages) {
        doShowPages(pdf);
    }
    if (m->list_attachments) {
        doListAttachments(pdf);
    }
    if (!m->attachment_to_show.empty()) {
        doShowAttachment(pdf);
    }
    if (!pdf.getWarnings().empty()) {
        m->warnings = true;
    }
}